

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter_impl.h
# Opt level: O1

void __thiscall spdlog::details::z_formatter::format(z_formatter *this,log_msg *msg,tm *tm_time)

{
  long lVar1;
  Buffer<char> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  
  lVar1 = tm_time->tm_gmtoff;
  pBVar2 = (msg->formatted).super_BasicWriter<char>.buffer_;
  if (pBVar2->size_ == pBVar2->capacity_) {
    (**pBVar2->_vptr_Buffer)(pBVar2,pBVar2->size_ + 1);
  }
  auVar6 = SEXT816(lVar1) * ZEXT816(0x8888888888888889);
  uVar7 = (int)(auVar6._8_8_ >> 5) - (auVar6._12_4_ >> 0x1f);
  uVar5 = -uVar7;
  if (0 < (int)uVar7) {
    uVar5 = uVar7;
  }
  pcVar3 = pBVar2->ptr_;
  sVar4 = pBVar2->size_;
  pBVar2->size_ = sVar4 + 1;
  pcVar3[sVar4] = (char)((int)uVar7 >> 0x1f) * -2 + '+';
  pad_n_join(&msg->formatted,uVar5 / 0x3c,uVar5 % 0x3c,(char)pcVar3);
  return;
}

Assistant:

void format(details::log_msg &msg, const std::tm &tm_time) override
    {
#ifdef _WIN32
        int total_minutes = get_cached_offset(msg, tm_time);
#else
        // No need to chache under gcc,
        // it is very fast (already stored in tm.tm_gmtoff)
        int total_minutes = os::utc_minutes_offset(tm_time);
#endif
        bool is_negative = total_minutes < 0;
        char sign;
        if (is_negative)
        {
            total_minutes = -total_minutes;
            sign = '-';
        }
        else
        {
            sign = '+';
        }

        int h = total_minutes / 60;
        int m = total_minutes % 60;
        msg.formatted << sign;
        pad_n_join(msg.formatted, h, m, ':');
    }